

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzeqnarray.cpp
# Opt level: O1

void __thiscall
TPZEqnArray<std::complex<double>_>::Print
          (TPZEqnArray<std::complex<double>_> *this,char *name,ostream *out)

{
  char cVar1;
  size_t sVar2;
  ostream *poVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  
  cVar1 = (char)out;
  if (name != (char *)0x0) {
    sVar2 = strlen(name);
    std::__ostream_insert<char,std::char_traits<char>>(out,name,sVar2);
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
  }
  uVar4 = (ulong)(uint)this->fNumEq;
  if (0 < this->fNumEq) {
    uVar5 = 0;
    do {
      if (uVar5 == (int)uVar4 - 1) {
        iVar7 = (int)(this->fEqValues).super_TPZManVector<std::complex<double>,_1000>.
                     super_TPZVec<std::complex<double>_>.fNElements;
      }
      else {
        iVar7 = (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore[uVar5 + 1];
      }
      iVar8 = (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore[uVar5];
      lVar6 = (long)iVar8;
      if (iVar8 < iVar7) {
        iVar8 = iVar7 - iVar8;
        do {
          std::__ostream_insert<char,std::char_traits<char>>(out,"col = ",6);
          poVar3 = (ostream *)
                   std::ostream::operator<<
                             (out,(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.
                                  fStore[lVar6]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"   ",3);
          lVar6 = lVar6 + 1;
          iVar8 = iVar8 + -1;
        } while (iVar8 != 0);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
      std::ostream::put(cVar1);
      std::ostream::flush();
      iVar8 = (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore[uVar5];
      if (iVar8 < iVar7) {
        lVar6 = (long)iVar8 << 4;
        iVar7 = iVar7 - iVar8;
        do {
          poVar3 = std::operator<<(out,(complex *)
                                       (((this->fEqValues).
                                         super_TPZManVector<std::complex<double>,_1000>.
                                         super_TPZVec<std::complex<double>_>.fStore)->_M_value +
                                       lVar6));
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  ",2);
          lVar6 = lVar6 + 0x10;
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
      std::ostream::put(cVar1);
      std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
      std::ostream::put(cVar1);
      std::ostream::flush();
      uVar5 = uVar5 + 1;
      uVar4 = (ulong)this->fNumEq;
    } while ((long)uVar5 < (long)uVar4);
  }
  return;
}

Assistant:

void TPZEqnArray<TVar>::Print(const char *name, std::ostream& out)
{
	if(name) out << name << endl;
	int i,j;
	for(i=0;i<fNumEq;i++){
		int aux_limit;
		
		if(i==fNumEq-1){
			aux_limit=fEqValues.NElements();
		}else aux_limit=fEqStart[i+1];
		for(j=fEqStart[i]; j<aux_limit ; j++) {
			out << "col = " << fIndex[j] << "   ";
		}
		out << endl;
		for(j=fEqStart[i]; j<aux_limit ; j++) {
			out << fEqValues[j] << "  ";
		}
		out << endl;
		out << endl;
	}
}